

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_path_and_type.cpp
# Opt level: O2

void duckdb::DBPathAndType::CheckMagicBytes(FileSystem *fs,string *path,string *db_type)

{
  MagicBytes::CheckMagicBytes(fs,path);
  ::std::__cxx11::string::assign((char *)db_type);
  return;
}

Assistant:

void DBPathAndType::CheckMagicBytes(FileSystem &fs, string &path, string &db_type) {
	// if there isn't - check the magic bytes of the file (if any)
	auto file_type = MagicBytes::CheckMagicBytes(fs, path);
	if (file_type == DataFileType::SQLITE_FILE) {
		db_type = "sqlite";
	} else {
		db_type = "";
	}
}